

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O1

string * __thiscall
libtorrent::dht_direct_response_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,dht_direct_response_alert *this)

{
  _Alloc_hider _Var1;
  char *pcVar2;
  size_t sVar3;
  char msg [1299];
  address local_598;
  long *local_578 [2];
  long local_568 [2];
  string local_558;
  char local_538 [1304];
  
  if ((this->endpoint).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_.base.sa_family == 2) {
    local_598._0_8_ =
         (ulong)(this->endpoint).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_.v6.
                sin6_flowinfo << 0x20;
    local_598.ipv6_address_.addr_.__in6_u._0_8_ = 0;
    local_598.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    local_598.ipv6_address_.scope_id_ = 0;
  }
  else {
    local_598.ipv6_address_.addr_.__in6_u._0_8_ =
         *(undefined8 *)
          ((long)&(this->endpoint).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_ + 8);
    local_598.ipv6_address_.addr_.__in6_u._8_8_ =
         *(undefined8 *)
          ((long)&(this->endpoint).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_ + 0x10);
    local_598.ipv6_address_.scope_id_ =
         (unsigned_long)
         (this->endpoint).super_basic_endpoint<boost::asio::ip::udp>.impl_.data_.v6.sin6_scope_id;
    local_598.type_ = ipv6;
    local_598.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
  }
  boost::asio::ip::address::to_string_abi_cxx11_(&local_558,&local_598);
  _Var1._M_p = local_558._M_dataplus._M_p;
  if (this->m_response_size == 0) {
    snprintf(local_538,0x513,"DHT direct response (address=%s) [ %s ]",local_558._M_dataplus._M_p,""
            );
  }
  else {
    pcVar2 = aux::stack_allocator::ptr
                       ((this->m_alloc)._M_data,(allocation_slot)(this->m_response_idx).m_idx);
    local_578[0] = local_568;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_578,pcVar2,pcVar2 + this->m_response_size);
    snprintf(local_538,0x513,"DHT direct response (address=%s) [ %s ]",_Var1._M_p,local_578[0]);
    if (local_578[0] != local_568) {
      operator_delete(local_578[0],local_568[0] + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != &local_558.field_2) {
    operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar3 = strlen(local_538);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_538,local_538 + sVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string dht_direct_response_alert::message() const
	{
		char msg[MAX_DHT_MUTABLE_DATA_LENGTH + 50];
		std::snprintf(msg, sizeof(msg), "DHT direct response (address=%s) [ %s ]"
			, endpoint.address().to_string().c_str()
			, m_response_size ? std::string(m_alloc.get().ptr(m_response_idx)
				, aux::numeric_cast<std::size_t>(m_response_size)).c_str() : "");
		return msg;
	}